

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O1

void start_pass_huff_decoder(j_decompress_ptr cinfo)

{
  int tblno;
  int tblno_00;
  jpeg_entropy_decoder *pjVar1;
  jpeg_error_mgr *pjVar2;
  jpeg_component_info *pjVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  
  pjVar1 = cinfo->entropy;
  if ((((cinfo->Ss != 0) || (cinfo->Se != 0x3f)) || (cinfo->Ah != 0)) || (cinfo->Al != 0)) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x7a;
    (*pjVar2->emit_message)((j_common_ptr)cinfo,-1);
  }
  if (0 < cinfo->comps_in_scan) {
    lVar6 = 0;
    do {
      tblno = cinfo->cur_comp_info[lVar6]->dc_tbl_no;
      tblno_00 = cinfo->cur_comp_info[lVar6]->ac_tbl_no;
      jpeg_make_d_derived_tbl
                (cinfo,1,tblno,(d_derived_tbl **)(&pjVar1[2].insufficient_data + (long)tblno * 2));
      jpeg_make_d_derived_tbl(cinfo,0,tblno_00,(d_derived_tbl **)(&pjVar1[4].start_pass + tblno_00))
      ;
      (&pjVar1[1].insufficient_data)[lVar6] = 0;
      lVar6 = lVar6 + 1;
    } while (lVar6 < cinfo->comps_in_scan);
  }
  if (0 < cinfo->blocks_in_MCU) {
    lVar6 = 0;
    do {
      pjVar3 = cinfo->cur_comp_info[cinfo->MCU_membership[lVar6]];
      (&pjVar1[5].decode_mcu)[lVar6] =
           *(_func_boolean_j_decompress_ptr_JBLOCKROW_ptr **)
            (&pjVar1[2].insufficient_data + (long)pjVar3->dc_tbl_no * 2);
      *(_func_void_j_decompress_ptr **)(&pjVar1[8].insufficient_data + lVar6 * 2) =
           (&pjVar1[4].start_pass)[pjVar3->ac_tbl_no];
      if (pjVar3->component_needed == 0) {
        (&pjVar1[0xd].insufficient_data)[lVar6] = 0;
        uVar4 = 0;
        lVar5 = 0x120;
      }
      else {
        *(undefined4 *)((long)&pjVar1[0xc].start_pass + lVar6 * 4) = 1;
        uVar4 = (uint)(1 < pjVar3->DCT_scaled_size);
        lVar5 = 0x148;
      }
      *(uint *)((long)&pjVar1->start_pass + lVar6 * 4 + lVar5) = uVar4;
      lVar6 = lVar6 + 1;
    } while (lVar6 < cinfo->blocks_in_MCU);
  }
  *(undefined4 *)&pjVar1[1].decode_mcu = 0;
  pjVar1[1].start_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar1->insufficient_data = 0;
  *(uint *)&pjVar1[2].decode_mcu = cinfo->restart_interval;
  return;
}

Assistant:

METHODDEF(void)
start_pass_huff_decoder(j_decompress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  int ci, blkn, dctbl, actbl;
  d_derived_tbl **pdtbl;
  jpeg_component_info *compptr;

  /* Check that the scan parameters Ss, Se, Ah/Al are OK for sequential JPEG.
   * This ought to be an error condition, but we make it a warning because
   * there are some baseline files out there with all zeroes in these bytes.
   */
  if (cinfo->Ss != 0 || cinfo->Se != DCTSIZE2 - 1 ||
      cinfo->Ah != 0 || cinfo->Al != 0)
    WARNMS(cinfo, JWRN_NOT_SEQUENTIAL);

  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    dctbl = compptr->dc_tbl_no;
    actbl = compptr->ac_tbl_no;
    /* Compute derived values for Huffman tables */
    /* We may do this more than once for a table, but it's not expensive */
    pdtbl = (d_derived_tbl **)(entropy->dc_derived_tbls) + dctbl;
    jpeg_make_d_derived_tbl(cinfo, TRUE, dctbl, pdtbl);
    pdtbl = (d_derived_tbl **)(entropy->ac_derived_tbls) + actbl;
    jpeg_make_d_derived_tbl(cinfo, FALSE, actbl, pdtbl);
    /* Initialize DC predictions to 0 */
    entropy->saved.last_dc_val[ci] = 0;
  }

  /* Precalculate decoding info for each block in an MCU of this scan */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];
    /* Precalculate which table to use for each block */
    entropy->dc_cur_tbls[blkn] = entropy->dc_derived_tbls[compptr->dc_tbl_no];
    entropy->ac_cur_tbls[blkn] = entropy->ac_derived_tbls[compptr->ac_tbl_no];
    /* Decide whether we really care about the coefficient values */
    if (compptr->component_needed) {
      entropy->dc_needed[blkn] = TRUE;
      /* we don't need the ACs if producing a 1/8th-size image */
      entropy->ac_needed[blkn] = (compptr->_DCT_scaled_size > 1);
    } else {
      entropy->dc_needed[blkn] = entropy->ac_needed[blkn] = FALSE;
    }
  }

  /* Initialize bitread state variables */
  entropy->bitstate.bits_left = 0;
  entropy->bitstate.get_buffer = 0; /* unnecessary, but keeps Purify quiet */
  entropy->pub.insufficient_data = FALSE;

  /* Initialize restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}